

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cc
# Opt level: O0

void Minisat::printOptions(FILE *pcsFile,int granularity)

{
  char *pcVar1;
  int iVar2;
  vec<Minisat::Option_*> *pvVar3;
  Option **ppOVar4;
  uint in_ESI;
  FILE *in_RDI;
  char *type;
  char *cat;
  int i;
  char *prev_type;
  char *prev_cat;
  int local_24;
  char *local_20;
  char *local_18;
  
  pvVar3 = Option::getOptionList();
  sort<Minisat::Option*,Minisat::Option::OptionLt>(pvVar3);
  local_18 = (char *)0x0;
  local_20 = (char *)0x0;
  local_24 = 0;
  while( true ) {
    pvVar3 = Option::getOptionList();
    iVar2 = vec<Minisat::Option_*>::size(pvVar3);
    if (iVar2 <= local_24) break;
    pvVar3 = Option::getOptionList();
    ppOVar4 = vec<Minisat::Option_*>::operator[](pvVar3,local_24);
    pcVar1 = (*ppOVar4)->category;
    pvVar3 = Option::getOptionList();
    ppOVar4 = vec<Minisat::Option_*>::operator[](pvVar3,local_24);
    if (pcVar1 == local_18) {
      if ((*ppOVar4)->type_name != local_20) {
        fprintf(in_RDI,"\n");
      }
    }
    else {
      fprintf(in_RDI,"\n#\n#%s OPTIONS:\n#\n",pcVar1);
    }
    pvVar3 = Option::getOptionList();
    ppOVar4 = vec<Minisat::Option_*>::operator[](pvVar3,local_24);
    (*(*ppOVar4)->_vptr_Option[7])(*ppOVar4,in_RDI,(ulong)in_ESI);
    pvVar3 = Option::getOptionList();
    ppOVar4 = vec<Minisat::Option_*>::operator[](pvVar3,local_24);
    local_18 = (*ppOVar4)->category;
    pvVar3 = Option::getOptionList();
    ppOVar4 = vec<Minisat::Option_*>::operator[](pvVar3,local_24);
    local_20 = (*ppOVar4)->type_name;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void MERGESAT_NSPACE::printOptions(FILE *pcsFile, int granularity)
{
    sort(Option::getOptionList(), Option::OptionLt());

    const char *prev_cat = nullptr;
    const char *prev_type = nullptr;

    // all options in the global list
    for (int i = 0; i < Option::getOptionList().size(); i++) {
        const char *cat = Option::getOptionList()[i]->category;
        const char *type = Option::getOptionList()[i]->type_name;

        // print new category
        if (cat != prev_cat) {
            fprintf(pcsFile, "\n#\n#%s OPTIONS:\n#\n", cat);
        } else if (type != prev_type) {
            fprintf(pcsFile, "\n");
        }

        // print the actual option
        Option::getOptionList()[i]->printOptions(pcsFile, granularity);

        // set prev values, so that print is nicer
        prev_cat = Option::getOptionList()[i]->category;
        prev_type = Option::getOptionList()[i]->type_name;
    }
}